

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idasRoberts_ASAi_dns.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  undefined4 uVar2;
  FILE *pFVar3;
  undefined8 uVar4;
  FILE *FID;
  IDAadjCheckPointRec *ckpnt;
  int ncheck;
  int retval;
  sunrealtype time;
  N_Vector qB;
  N_Vector ypB;
  N_Vector yB;
  sunrealtype abstolQB;
  sunrealtype abstolB;
  sunrealtype reltolB;
  int indexB;
  int steps;
  N_Vector id;
  N_Vector ypTB1;
  N_Vector yyTB1;
  N_Vector q;
  N_Vector yp;
  N_Vector yy;
  sunrealtype abstolQ;
  sunrealtype reltolQ;
  SUNLinearSolver LSB;
  SUNLinearSolver LS;
  SUNMatrix AB;
  SUNMatrix A;
  void *ida_mem;
  UserData data;
  SUNContext ctx;
  undefined4 in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff1c;
  char *in_stack_ffffffffffffff20;
  N_Vector yB_00;
  undefined4 in_stack_ffffffffffffff30;
  undefined1 local_c8 [8];
  long *local_c0;
  long *local_b8;
  long *local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined4 local_90;
  undefined4 local_8c;
  long *local_88;
  undefined8 local_80;
  undefined8 local_78;
  long *local_70;
  long *local_68;
  long *local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 *local_20;
  undefined8 local_18 [2];
  int local_4;
  
  local_4 = 0;
  local_20 = (undefined8 *)0x0;
  yB_00 = (N_Vector)0x0;
  local_28 = 0;
  local_38 = 0;
  local_30 = 0;
  local_48 = 0;
  local_40 = 0;
  local_c0 = (long *)0x0;
  local_b0 = (long *)0x0;
  local_68 = (long *)0x0;
  local_60 = (long *)0x0;
  printf("\nAdjoint Sensitivity Example for Chemical Kinetics\n");
  printf("-------------------------------------------------\n\n");
  printf("DAE: dy1/dt + p1*y1 - p2*y2*y3 = 0\n");
  printf("     dy2/dt - p1*y1 + p2*y2*y3 + p3*(y2)^2 = 0\n");
  printf("               y1  +  y2  +  y3 = 0\n\n");
  printf("Find dG/dp for\n");
  printf("     G = int_t0^tB0 g(t,p,y) dt\n");
  printf("     g(t,p,y) = y3\n\n\n");
  SUNContext_Create(0,local_18);
  iVar1 = check_retval(yB_00,in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
  if (iVar1 == 0) {
    local_20 = (undefined8 *)malloc(0x18);
    iVar1 = check_retval(yB_00,in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
    if (iVar1 == 0) {
      *local_20 = 0x3fa47ae147ae147b;
      local_20[1] = 0x40c3880000000000;
      local_20[2] = 0x417c9c3800000000;
      local_60 = (long *)N_VNew_Serial(3,local_18[0]);
      iVar1 = check_retval(yB_00,in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
      if (iVar1 == 0) {
        **(undefined8 **)(*local_60 + 0x10) = 0x3ff0000000000000;
        *(undefined8 *)(*(long *)(*local_60 + 0x10) + 8) = 0;
        *(undefined8 *)(*(long *)(*local_60 + 0x10) + 0x10) = 0;
        local_68 = (long *)N_VClone(local_60);
        iVar1 = check_retval(yB_00,in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
        if (iVar1 == 0) {
          **(undefined8 **)(*local_68 + 0x10) = 0xbfa47ae147ae147b;
          *(undefined8 *)(*(long *)(*local_68 + 0x10) + 8) = 0x3fa47ae147ae147b;
          *(undefined8 *)(*(long *)(*local_68 + 0x10) + 0x10) = 0;
          local_70 = (long *)N_VNew_Serial(1,local_18[0]);
          iVar1 = check_retval(yB_00,in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
          if (iVar1 == 0) {
            **(undefined8 **)(*local_70 + 0x10) = 0;
            local_50 = 0x3eb0c6f7a0b5ed8d;
            local_58 = 0x3eb0c6f7a0b5ed8d;
            printf("Create and allocate IDAS memory for forward runs\n");
            local_28 = IDACreate(local_18[0]);
            iVar1 = check_retval(yB_00,in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
            if (iVar1 == 0) {
              IDAInit(0,local_28,res,local_60,local_68);
              iVar1 = check_retval(yB_00,in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
              if (iVar1 == 0) {
                IDAWFtolerances(local_28,ewt);
                iVar1 = check_retval(yB_00,in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
                if (iVar1 == 0) {
                  IDASetUserData(local_28,local_20);
                  iVar1 = check_retval(yB_00,in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
                  if (iVar1 == 0) {
                    local_30 = SUNDenseMatrix(3,3,local_18[0]);
                    iVar1 = check_retval(yB_00,in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
                    if (iVar1 == 0) {
                      local_40 = SUNLinSol_Dense(local_60,local_30,local_18[0]);
                      iVar1 = check_retval(yB_00,in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c
                                          );
                      if (iVar1 == 0) {
                        IDASetLinearSolver(local_28,local_40,local_30);
                        iVar1 = check_retval(yB_00,in_stack_ffffffffffffff20,
                                             in_stack_ffffffffffffff1c);
                        if (iVar1 == 0) {
                          IDASetJacFn(local_28,Jac);
                          iVar1 = check_retval(yB_00,in_stack_ffffffffffffff20,
                                               in_stack_ffffffffffffff1c);
                          if (iVar1 == 0) {
                            IDAQuadInit(local_28,rhsQ,local_70);
                            iVar1 = check_retval(yB_00,in_stack_ffffffffffffff20,
                                                 in_stack_ffffffffffffff1c);
                            if (iVar1 == 0) {
                              IDAQuadSStolerances(local_50,local_58,local_28);
                              iVar1 = check_retval(yB_00,in_stack_ffffffffffffff20,
                                                   in_stack_ffffffffffffff1c);
                              if (iVar1 == 0) {
                                IDASetQuadErrCon(local_28,1);
                                iVar1 = check_retval(yB_00,in_stack_ffffffffffffff20,
                                                     in_stack_ffffffffffffff1c);
                                if (iVar1 == 0) {
                                  IDASetMaxNumSteps(local_28,0x9c4);
                                  iVar1 = check_retval(yB_00,in_stack_ffffffffffffff20,
                                                       in_stack_ffffffffffffff1c);
                                  if (iVar1 == 0) {
                                    local_8c = 100;
                                    IDAAdjInit(local_28,100,1);
                                    iVar1 = check_retval(yB_00,in_stack_ffffffffffffff20,
                                                         in_stack_ffffffffffffff1c);
                                    if (iVar1 == 0) {
                                      printf("Forward integration ...\n");
                                      IDASolveF(0x4049000000000000,local_28,local_c8,local_60,
                                                local_68,1,&stack0xffffffffffffff30);
                                      iVar1 = check_retval(yB_00,in_stack_ffffffffffffff20,
                                                           in_stack_ffffffffffffff1c);
                                      if (iVar1 == 0) {
                                        local_78 = N_VClone(local_60);
                                        local_80 = N_VClone(local_68);
                                        N_VScale(0x3ff0000000000000,local_60,local_78);
                                        N_VScale(0x3ff0000000000000,local_68,local_80);
                                        IDASolveF(0x4222a05f20000000,local_28,local_c8,local_60,
                                                  local_68,1,&stack0xffffffffffffff30);
                                        iVar1 = check_retval(yB_00,in_stack_ffffffffffffff20,
                                                             in_stack_ffffffffffffff1c);
                                        if (iVar1 == 0) {
                                          IDAGetQuad(local_28,local_c8,local_70);
                                          iVar1 = check_retval(yB_00,in_stack_ffffffffffffff20,
                                                               in_stack_ffffffffffffff1c);
                                          if (iVar1 == 0) {
                                            printf(
                                                  "--------------------------------------------------------\n"
                                                  );
                                            printf("G:          %12.4e \n",
                                                   **(undefined8 **)(*local_70 + 0x10));
                                            printf(
                                                  "--------------------------------------------------------\n"
                                                  );
                                            printf("\nFinal Statistics:\n");
                                            IDAPrintAllStats(local_28,_stdout,0);
                                            pFVar3 = fopen("idasRoberts_ASAi_dns_fwd_stats.csv","w")
                                            ;
                                            IDAPrintAllStats(local_28,pFVar3,1);
                                            fclose(pFVar3);
                                            local_b0 = (long *)N_VClone(local_60);
                                            iVar1 = check_retval(yB_00,(char *)pFVar3,
                                                                 in_stack_ffffffffffffff1c);
                                            if (iVar1 == 0) {
                                              **(undefined8 **)(*local_b0 + 0x10) = 0;
                                              *(undefined8 *)(*(long *)(*local_b0 + 0x10) + 8) = 0;
                                              *(undefined8 *)(*(long *)(*local_b0 + 0x10) + 0x10) =
                                                   0x3ff0000000000000;
                                              local_b8 = (long *)N_VClone(local_60);
                                              iVar1 = check_retval(yB_00,(char *)pFVar3,
                                                                   in_stack_ffffffffffffff1c);
                                              if (iVar1 == 0) {
                                                **(undefined8 **)(*local_b8 + 0x10) =
                                                     0x3ff0000000000000;
                                                *(undefined8 *)(*(long *)(*local_b8 + 0x10) + 8) =
                                                     0x3ff0000000000000;
                                                *(undefined8 *)(*(long *)(*local_b8 + 0x10) + 0x10)
                                                     = 0;
                                                local_98 = 0x3eb0c6f7a0b5ed8d;
                                                local_a0 = 0x3e45798ee2308c3a;
                                                local_a8 = 0x3eb0c6f7a0b5ed8d;
                                                printf(
                                                  "\nCreate and allocate IDAS memory for backward run\n"
                                                  );
                                                IDACreateB(local_28,&local_90);
                                                iVar1 = check_retval(yB_00,(char *)pFVar3,
                                                                     in_stack_ffffffffffffff1c);
                                                if (iVar1 == 0) {
                                                  IDAInitB(0x4222a05f20000000,local_28,local_90,resB
                                                           ,local_b0,local_b8);
                                                  iVar1 = check_retval(yB_00,(char *)pFVar3,
                                                                       in_stack_ffffffffffffff1c);
                                                  if (iVar1 == 0) {
                                                    IDASStolerancesB(local_98,local_a0,local_28,
                                                                     local_90);
                                                    iVar1 = check_retval(yB_00,(char *)pFVar3,
                                                                         in_stack_ffffffffffffff1c);
                                                    if (iVar1 == 0) {
                                                      IDASetUserDataB(local_28,local_90,local_20);
                                                      iVar1 = check_retval(yB_00,(char *)pFVar3,
                                                                           in_stack_ffffffffffffff1c
                                                                          );
                                                      if (iVar1 == 0) {
                                                        IDASetMaxNumStepsB(local_28,local_90,1000);
                                                        iVar1 = check_retval(yB_00,(char *)pFVar3,
                                                                                                                                                          
                                                  in_stack_ffffffffffffff1c);
                                                  if (iVar1 == 0) {
                                                    local_38 = SUNDenseMatrix(3,3,local_18[0]);
                                                    iVar1 = check_retval(yB_00,(char *)pFVar3,
                                                                         in_stack_ffffffffffffff1c);
                                                    if (iVar1 == 0) {
                                                      local_48 = SUNLinSol_Dense(local_b0,local_38,
                                                                                 local_18[0]);
                                                      iVar1 = check_retval(yB_00,(char *)pFVar3,
                                                                           in_stack_ffffffffffffff1c
                                                                          );
                                                      if (iVar1 == 0) {
                                                        IDASetLinearSolverB(local_28,local_90,
                                                                            local_48,local_38);
                                                        iVar1 = check_retval(yB_00,(char *)pFVar3,
                                                                                                                                                          
                                                  in_stack_ffffffffffffff1c);
                                                  if (iVar1 == 0) {
                                                    IDASetJacFnB(local_28,local_90,JacB);
                                                    iVar1 = check_retval(yB_00,(char *)pFVar3,
                                                                         in_stack_ffffffffffffff1c);
                                                    if (iVar1 == 0) {
                                                      local_c0 = (long *)N_VNew_Serial(3,local_18[0]
                                                                                      );
                                                      iVar1 = check_retval(yB_00,(char *)pFVar3,
                                                                           in_stack_ffffffffffffff1c
                                                                          );
                                                      if (iVar1 == 0) {
                                                        **(undefined8 **)(*local_c0 + 0x10) = 0;
                                                        *(undefined8 *)
                                                         (*(long *)(*local_c0 + 0x10) + 8) = 0;
                                                        *(undefined8 *)
                                                         (*(long *)(*local_c0 + 0x10) + 0x10) = 0;
                                                        IDAQuadInitB(local_28,local_90,rhsQB,
                                                                     local_c0);
                                                        iVar1 = check_retval(yB_00,(char *)pFVar3,
                                                                                                                                                          
                                                  in_stack_ffffffffffffff1c);
                                                  if (iVar1 == 0) {
                                                    IDAQuadSStolerancesB
                                                              (local_98,local_a8,local_28,local_90);
                                                    iVar1 = check_retval(yB_00,(char *)pFVar3,
                                                                         in_stack_ffffffffffffff1c);
                                                    if (iVar1 == 0) {
                                                      IDASetQuadErrConB(local_28,local_90,1);
                                                      iVar1 = check_retval(yB_00,(char *)pFVar3,
                                                                           in_stack_ffffffffffffff1c
                                                                          );
                                                      if (iVar1 == 0) {
                                                        printf("Backward integration ...\n");
                                                        IDASolveB(0,local_28,1);
                                                        iVar1 = check_retval(yB_00,(char *)pFVar3,
                                                                                                                                                          
                                                  in_stack_ffffffffffffff1c);
                                                  if (iVar1 == 0) {
                                                    IDAGetB(local_28,local_90,local_c8,local_b0,
                                                            local_b8);
                                                    iVar1 = check_retval(yB_00,(char *)pFVar3,
                                                                         in_stack_ffffffffffffff1c);
                                                    if (iVar1 == 0) {
                                                      uVar2 = IDAGetQuadB(local_28,local_90,local_c8
                                                                          ,local_c0);
                                                      iVar1 = check_retval(yB_00,(char *)pFVar3,
                                                                           in_stack_ffffffffffffff1c
                                                                          );
                                                      if (iVar1 == 0) {
                                                        PrintOutput((sunrealtype)
                                                                    CONCAT44(uVar2,
                                                  in_stack_ffffffffffffff30),yB_00,(N_Vector)pFVar3,
                                                  (N_Vector)
                                                  CONCAT44(in_stack_ffffffffffffff1c,
                                                           in_stack_ffffffffffffff18));
                                                  printf("\nFinal Statistics:\n");
                                                  uVar4 = IDAGetAdjIDABmem(local_28,local_90);
                                                  IDAPrintAllStats(uVar4,_stdout,0);
                                                  pFVar3 = fopen(
                                                  "idasRoberts_ASAi_dns_bkw1_stats.csv","w");
                                                  uVar4 = IDAGetAdjIDABmem(local_28,local_90);
                                                  IDAPrintAllStats(uVar4,pFVar3,1);
                                                  fclose(pFVar3);
                                                  printf(
                                                  "\nRe-initialize IDAS memory for backward run\n");
                                                  **(undefined8 **)(*local_b0 + 0x10) = 0;
                                                  *(undefined8 *)(*(long *)(*local_b0 + 0x10) + 8) =
                                                       0;
                                                  *(undefined8 *)
                                                   (*(long *)(*local_b0 + 0x10) + 0x10) =
                                                       0x3fe0000000000000;
                                                  **(undefined8 **)(*local_b8 + 0x10) =
                                                       0x3fe999999999999a;
                                                  *(undefined8 *)(*(long *)(*local_b8 + 0x10) + 8) =
                                                       0x3fe8000000000000;
                                                  *(undefined8 *)
                                                   (*(long *)(*local_b8 + 0x10) + 0x10) = 0;
                                                  **(undefined8 **)(*local_c0 + 0x10) = 0;
                                                  *(undefined8 *)(*(long *)(*local_c0 + 0x10) + 8) =
                                                       0;
                                                  *(undefined8 *)
                                                   (*(long *)(*local_c0 + 0x10) + 0x10) = 0;
                                                  IDAReInitB(0x4049000000000000,local_28,local_90,
                                                             local_b0,local_b8);
                                                  iVar1 = check_retval(yB_00,(char *)pFVar3,
                                                                       in_stack_ffffffffffffff1c);
                                                  if (iVar1 == 0) {
                                                    IDAQuadReInitB(local_28,local_90,local_c0);
                                                    iVar1 = check_retval(yB_00,(char *)pFVar3,
                                                                         in_stack_ffffffffffffff1c);
                                                    if (iVar1 == 0) {
                                                      local_88 = (long *)N_VClone(local_60);
                                                      **(undefined8 **)(*local_88 + 0x10) =
                                                           0x3ff0000000000000;
                                                      *(undefined8 *)
                                                       (*(long *)(*local_88 + 0x10) + 8) =
                                                           0x3ff0000000000000;
                                                      *(undefined8 *)
                                                       (*(long *)(*local_88 + 0x10) + 0x10) = 0;
                                                      IDASetIdB(local_28,local_90,local_88);
                                                      iVar1 = check_retval(yB_00,(char *)pFVar3,
                                                                           in_stack_ffffffffffffff1c
                                                                          );
                                                      if (iVar1 == 0) {
                                                        IDACalcICB(0x4048800000000000,local_28,
                                                                   local_90,local_78,local_80);
                                                        iVar1 = check_retval(yB_00,(char *)pFVar3,
                                                                                                                                                          
                                                  in_stack_ffffffffffffff1c);
                                                  if (iVar1 == 0) {
                                                    IDAGetConsistentICB(local_28,local_90,local_b0,
                                                                        local_b8);
                                                    iVar1 = check_retval(yB_00,(char *)pFVar3,
                                                                         in_stack_ffffffffffffff1c);
                                                    if (iVar1 == 0) {
                                                      IDASolveB(0,local_28,1);
                                                      iVar1 = check_retval(yB_00,(char *)pFVar3,
                                                                           in_stack_ffffffffffffff1c
                                                                          );
                                                      if (iVar1 == 0) {
                                                        IDAGetB(local_28,local_90,local_c8,local_b0,
                                                                local_b8);
                                                        iVar1 = check_retval(yB_00,(char *)pFVar3,
                                                                                                                                                          
                                                  in_stack_ffffffffffffff1c);
                                                  if (iVar1 == 0) {
                                                    uVar2 = IDAGetQuadB(local_28,local_90,local_c8,
                                                                        local_c0);
                                                    iVar1 = check_retval(yB_00,(char *)pFVar3,
                                                                         in_stack_ffffffffffffff1c);
                                                    if (iVar1 == 0) {
                                                      PrintOutput((sunrealtype)
                                                                  CONCAT44(uVar2,
                                                  in_stack_ffffffffffffff30),yB_00,(N_Vector)pFVar3,
                                                  (N_Vector)
                                                  CONCAT44(in_stack_ffffffffffffff1c,
                                                           in_stack_ffffffffffffff18));
                                                  printf("\nFinal Statistics:\n");
                                                  uVar4 = IDAGetAdjIDABmem(local_28,local_90);
                                                  IDAPrintAllStats(uVar4,_stdout,0);
                                                  pFVar3 = fopen(
                                                  "idasRoberts_ASAi_dns_bkw1_stats.csv","w");
                                                  uVar4 = IDAGetAdjIDABmem(local_28,local_90);
                                                  IDAPrintAllStats(uVar4,pFVar3,1);
                                                  fclose(pFVar3);
                                                  IDAFree(&local_28);
                                                  SUNLinSolFree(local_40);
                                                  SUNMatDestroy(local_30);
                                                  SUNLinSolFree(local_48);
                                                  SUNMatDestroy(local_38);
                                                  N_VDestroy(local_60);
                                                  N_VDestroy(local_68);
                                                  N_VDestroy(local_70);
                                                  N_VDestroy(local_b0);
                                                  N_VDestroy(local_b8);
                                                  N_VDestroy(local_c0);
                                                  N_VDestroy(local_88);
                                                  N_VDestroy(local_78);
                                                  N_VDestroy(local_80);
                                                  if (yB_00 != (N_Vector)0x0) {
                                                    free(yB_00);
                                                  }
                                                  free(local_20);
                                                  SUNContext_Free(local_18);
                                                  local_4 = 0;
                                                  }
                                                  else {
                                                    local_4 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_4 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_4 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_4 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_4 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_4 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_4 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_4 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_4 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_4 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_4 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_4 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_4 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_4 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_4 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_4 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_4 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_4 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_4 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_4 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_4 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_4 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_4 = 1;
                                                  }
                                                }
                                                else {
                                                  local_4 = 1;
                                                }
                                              }
                                              else {
                                                local_4 = 1;
                                              }
                                            }
                                            else {
                                              local_4 = 1;
                                            }
                                          }
                                          else {
                                            local_4 = 1;
                                          }
                                        }
                                        else {
                                          local_4 = 1;
                                        }
                                      }
                                      else {
                                        local_4 = 1;
                                      }
                                    }
                                    else {
                                      local_4 = 1;
                                    }
                                  }
                                  else {
                                    local_4 = 1;
                                  }
                                }
                                else {
                                  local_4 = 1;
                                }
                              }
                              else {
                                local_4 = 1;
                              }
                            }
                            else {
                              local_4 = 1;
                            }
                          }
                          else {
                            local_4 = 1;
                          }
                        }
                        else {
                          local_4 = 1;
                        }
                      }
                      else {
                        local_4 = 1;
                      }
                    }
                    else {
                      local_4 = 1;
                    }
                  }
                  else {
                    local_4 = 1;
                  }
                }
                else {
                  local_4 = 1;
                }
              }
              else {
                local_4 = 1;
              }
            }
            else {
              local_4 = 1;
            }
          }
          else {
            local_4 = 1;
          }
        }
        else {
          local_4 = 1;
        }
      }
      else {
        local_4 = 1;
      }
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int main(int argc, char* argv[])
{
  SUNContext ctx;

  UserData data;

  void* ida_mem;
  SUNMatrix A, AB;
  SUNLinearSolver LS, LSB;

  sunrealtype reltolQ, abstolQ;
  N_Vector yy, yp, q;
  N_Vector yyTB1, ypTB1;
  N_Vector id;

  int steps;

  int indexB;

  sunrealtype reltolB, abstolB, abstolQB;
  N_Vector yB, ypB, qB;
  sunrealtype time;
  int retval, ncheck;

  IDAadjCheckPointRec* ckpnt;

  FILE* FID;

  data    = NULL;
  ckpnt   = NULL;
  ida_mem = NULL;
  A = AB = NULL;
  LS = LSB = NULL;
  yy = yp = yB = qB = NULL;

  /* Print problem description */
  printf("\nAdjoint Sensitivity Example for Chemical Kinetics\n");
  printf("-------------------------------------------------\n\n");
  printf("DAE: dy1/dt + p1*y1 - p2*y2*y3 = 0\n");
  printf("     dy2/dt - p1*y1 + p2*y2*y3 + p3*(y2)^2 = 0\n");
  printf("               y1  +  y2  +  y3 = 0\n\n");
  printf("Find dG/dp for\n");
  printf("     G = int_t0^tB0 g(t,p,y) dt\n");
  printf("     g(t,p,y) = y3\n\n\n");

  /* Create the SUNDIALS context object for this simulation */
  retval = SUNContext_Create(SUN_COMM_NULL, &ctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return 1; }

  /* User data structure */
  data = (UserData)malloc(sizeof *data);
  if (check_retval((void*)data, "malloc", 2)) { return (1); }
  data->p[0] = SUN_RCONST(0.04);
  data->p[1] = SUN_RCONST(1.0e4);
  data->p[2] = SUN_RCONST(3.0e7);

  /* Initialize y */
  yy = N_VNew_Serial(NEQ, ctx);
  if (check_retval((void*)yy, "N_VNew_Serial", 0)) { return (1); }
  Ith(yy, 1) = ONE;
  Ith(yy, 2) = ZERO;
  Ith(yy, 3) = ZERO;

  /* Initialize yprime */
  yp = N_VClone(yy);
  if (check_retval((void*)yp, "N_VNew_Serial", 0)) { return (1); }
  Ith(yp, 1) = SUN_RCONST(-0.04);
  Ith(yp, 2) = SUN_RCONST(0.04);
  Ith(yp, 3) = ZERO;

  /* Initialize q */
  q = N_VNew_Serial(1, ctx);
  if (check_retval((void*)q, "N_VNew_Serial", 0)) { return (1); }
  Ith(q, 1) = ZERO;

  /* Set the scalar realtive and absolute tolerances reltolQ and abstolQ */
  reltolQ = RTOL;
  abstolQ = ATOLQ;

  /* Create and allocate IDAS memory for forward run */
  printf("Create and allocate IDAS memory for forward runs\n");

  ida_mem = IDACreate(ctx);
  if (check_retval((void*)ida_mem, "IDACreate", 0)) { return (1); }

  retval = IDAInit(ida_mem, res, T0, yy, yp);
  if (check_retval(&retval, "IDAInit", 1)) { return (1); }

  retval = IDAWFtolerances(ida_mem, ewt);
  if (check_retval(&retval, "IDAWFtolerances", 1)) { return (1); }

  retval = IDASetUserData(ida_mem, data);
  if (check_retval(&retval, "IDASetUserData", 1)) { return (1); }

  /* Create dense SUNMatrix for use in linear solves */
  A = SUNDenseMatrix(NEQ, NEQ, ctx);
  if (check_retval((void*)A, "SUNDenseMatrix", 0)) { return (1); }

  /* Create dense SUNLinearSolver object */
  LS = SUNLinSol_Dense(yy, A, ctx);
  if (check_retval((void*)LS, "SUNLinSol_Dense", 0)) { return (1); }

  /* Attach the matrix and linear solver */
  retval = IDASetLinearSolver(ida_mem, LS, A);
  if (check_retval(&retval, "IDASetLinearSolver", 1)) { return (1); }

  /* Set the user-supplied Jacobian routine */
  retval = IDASetJacFn(ida_mem, Jac);
  if (check_retval(&retval, "IDASetJacFn", 1)) { return (1); }

  /* Setup quadrature integration */
  retval = IDAQuadInit(ida_mem, rhsQ, q);
  if (check_retval(&retval, "IDAQuadInit", 1)) { return (1); }

  retval = IDAQuadSStolerances(ida_mem, reltolQ, abstolQ);
  if (check_retval(&retval, "IDAQuadSStolerances", 1)) { return (1); }

  retval = IDASetQuadErrCon(ida_mem, SUNTRUE);
  if (check_retval(&retval, "IDASetQuadErrCon", 1)) { return (1); }

  /* Call IDASetMaxNumSteps to set the maximum number of steps the
   * solver will take in an attempt to reach the next output time
   * during forward integration. */
  retval = IDASetMaxNumSteps(ida_mem, 2500);
  if (check_retval(&retval, "IDASetMaxNumSteps", 1)) { return (1); }

  /* Allocate global memory */

  steps  = STEPS;
  retval = IDAAdjInit(ida_mem, steps, IDA_HERMITE);
  /*retval = IDAAdjInit(ida_mem, steps, IDA_POLYNOMIAL);*/
  if (check_retval(&retval, "IDAAdjInit", 1)) { return (1); }

  /* Perform forward run */
  printf("Forward integration ...\n");

  /* Integrate till TB1 and get the solution (y, y') at that time. */
  retval = IDASolveF(ida_mem, TB1, &time, yy, yp, IDA_NORMAL, &ncheck);
  if (check_retval(&retval, "IDASolveF", 1)) { return (1); }

  yyTB1 = N_VClone(yy);
  ypTB1 = N_VClone(yp);
  /* Save the states at t=TB1. */
  N_VScale(ONE, yy, yyTB1);
  N_VScale(ONE, yp, ypTB1);

  /* Continue integrating till TOUT is reached. */
  retval = IDASolveF(ida_mem, TOUT, &time, yy, yp, IDA_NORMAL, &ncheck);
  if (check_retval(&retval, "IDASolveF", 1)) { return (1); }

  retval = IDAGetQuad(ida_mem, &time, q);
  if (check_retval(&retval, "IDAGetQuad", 1)) { return (1); }

  printf("--------------------------------------------------------\n");
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("G:          %12.4Le \n", Ith(q, 1));
#elif defined(SUNDIALS_DOUBLE_PRECISION)
  printf("G:          %12.4e \n", Ith(q, 1));
#else
  printf("G:          %12.4e \n", Ith(q, 1));
#endif
  printf("--------------------------------------------------------\n");

  /* Print final statistics to the screen */
  printf("\nFinal Statistics:\n");
  retval = IDAPrintAllStats(ida_mem, stdout, SUN_OUTPUTFORMAT_TABLE);

  /* Print final statistics to a file in CSV format */
  FID    = fopen("idasRoberts_ASAi_dns_fwd_stats.csv", "w");
  retval = IDAPrintAllStats(ida_mem, FID, SUN_OUTPUTFORMAT_CSV);
  fclose(FID);

  /* Test check point linked list
     (uncomment next block to print check point information) */

  /*
  {
    int i;

    printf("\nList of Check Points (ncheck = %d)\n\n", ncheck);
    ckpnt = (IDAadjCheckPointRec *) malloc ( (ncheck+1)*sizeof(IDAadjCheckPointRec));
    IDAGetAdjCheckPointsInfo(ida_mem, ckpnt);
    for (i=0;i<=ncheck;i++) {
      printf("Address:       %p\n",ckpnt[i].my_addr);
      printf("Next:          %p\n",ckpnt[i].next_addr);
      printf("Time interval: %le  %le\n",ckpnt[i].t0, ckpnt[i].t1);
      printf("Step number:   %ld\n",ckpnt[i].nstep);
      printf("Order:         %d\n",ckpnt[i].order);
      printf("Step size:     %le\n",ckpnt[i].step);
      printf("\n");
    }

  }
  */

  /* Create BACKWARD problem. */

  /* Allocate yB (i.e. lambda_0). */
  yB = N_VClone(yy);
  if (check_retval((void*)yB, "N_VNew_Serial", 0)) { return (1); }

  /* Consistently initialize yB. */
  Ith(yB, 1) = ZERO;
  Ith(yB, 2) = ZERO;
  Ith(yB, 3) = ONE;

  /* Allocate ypB (i.e. lambda'_0). */
  ypB = N_VClone(yy);
  if (check_retval((void*)ypB, "N_VNew_Serial", 0)) { return (1); }

  /* Consistently initialize ypB. */
  Ith(ypB, 1) = ONE;
  Ith(ypB, 2) = ONE;
  Ith(ypB, 3) = ZERO;

  /* Set the scalar relative tolerance reltolB */
  reltolB = RTOL;

  /* Set the scalar absolute tolerance abstolB */
  abstolB = ATOLA;

  /* Set the scalar absolute tolerance abstolQB */
  abstolQB = ATOLQ;

  /* Create and allocate IDAS memory for backward run */
  printf("\nCreate and allocate IDAS memory for backward run\n");

  retval = IDACreateB(ida_mem, &indexB);
  if (check_retval(&retval, "IDACreateB", 1)) { return (1); }

  retval = IDAInitB(ida_mem, indexB, resB, TB2, yB, ypB);
  if (check_retval(&retval, "IDAInitB", 1)) { return (1); }

  retval = IDASStolerancesB(ida_mem, indexB, reltolB, abstolB);
  if (check_retval(&retval, "IDASStolerancesB", 1)) { return (1); }

  retval = IDASetUserDataB(ida_mem, indexB, data);
  if (check_retval(&retval, "IDASetUserDataB", 1)) { return (1); }

  retval = IDASetMaxNumStepsB(ida_mem, indexB, 1000);
  if (check_retval(&retval, "IDASetMaxNumStepsB", 1)) { return (1); }

  /* Create dense SUNMatrix for use in linear solves */
  AB = SUNDenseMatrix(NEQ, NEQ, ctx);
  if (check_retval((void*)AB, "SUNDenseMatrix", 0)) { return (1); }

  /* Create dense SUNLinearSolver object */
  LSB = SUNLinSol_Dense(yB, AB, ctx);
  if (check_retval((void*)LSB, "SUNLinSol_Dense", 0)) { return (1); }

  /* Attach the matrix and linear solver */
  retval = IDASetLinearSolverB(ida_mem, indexB, LSB, AB);
  if (check_retval(&retval, "IDASetLinearSolverB", 1)) { return (1); }

  /* Set the user-supplied Jacobian routine */
  retval = IDASetJacFnB(ida_mem, indexB, JacB);
  if (check_retval(&retval, "IDASetJacFnB", 1)) { return (1); }

  /* Quadrature for backward problem. */

  /* Initialize qB */
  qB = N_VNew_Serial(NP, ctx);
  if (check_retval((void*)qB, "N_VNew", 0)) { return (1); }
  Ith(qB, 1) = ZERO;
  Ith(qB, 2) = ZERO;
  Ith(qB, 3) = ZERO;

  retval = IDAQuadInitB(ida_mem, indexB, rhsQB, qB);
  if (check_retval(&retval, "IDAQuadInitB", 1)) { return (1); }

  retval = IDAQuadSStolerancesB(ida_mem, indexB, reltolB, abstolQB);
  if (check_retval(&retval, "IDAQuadSStolerancesB", 1)) { return (1); }

  /* Include quadratures in error control. */
  retval = IDASetQuadErrConB(ida_mem, indexB, SUNTRUE);
  if (check_retval(&retval, "IDASetQuadErrConB", 1)) { return (1); }

  /* Backward Integration */
  printf("Backward integration ...\n");

  retval = IDASolveB(ida_mem, T0, IDA_NORMAL);
  if (check_retval(&retval, "IDASolveB", 1)) { return (1); }

  retval = IDAGetB(ida_mem, indexB, &time, yB, ypB);
  if (check_retval(&retval, "IDAGetB", 1)) { return (1); }

  retval = IDAGetQuadB(ida_mem, indexB, &time, qB);
  if (check_retval(&retval, "IDAGetB", 1)) { return (1); }

  PrintOutput(TB2, yB, ypB, qB);

  /* Print final statistics to the screen */
  printf("\nFinal Statistics:\n");
  retval = IDAPrintAllStats(IDAGetAdjIDABmem(ida_mem, indexB), stdout,
                            SUN_OUTPUTFORMAT_TABLE);

  /* Print final statistics to a file in CSV format */
  FID    = fopen("idasRoberts_ASAi_dns_bkw1_stats.csv", "w");
  retval = IDAPrintAllStats(IDAGetAdjIDABmem(ida_mem, indexB), FID,
                            SUN_OUTPUTFORMAT_CSV);
  fclose(FID);

  /* Reinitialize backward phase and start from a different time (TB1). */
  printf("\nRe-initialize IDAS memory for backward run\n");

  /* Both algebraic part from y and the entire y' are computed by IDACalcIC. */
  Ith(yB, 1) = ZERO;
  Ith(yB, 2) = ZERO;
  Ith(yB, 3) = SUN_RCONST(0.50); /* not consistent */

  /* Rough guess for ypB. */
  Ith(ypB, 1) = SUN_RCONST(0.80);
  Ith(ypB, 2) = SUN_RCONST(0.75);
  Ith(ypB, 3) = ZERO;

  /* Initialize qB */
  Ith(qB, 1) = ZERO;
  Ith(qB, 2) = ZERO;
  Ith(qB, 3) = ZERO;

  retval = IDAReInitB(ida_mem, indexB, TB1, yB, ypB);
  if (check_retval(&retval, "IDAReInitB", 1)) { return (1); }

  /* Also reinitialize quadratures. */
  retval = IDAQuadReInitB(ida_mem, indexB, qB);
  if (check_retval(&retval, "IDAQuadReInitB", 1)) { return (1); }

  /* Use IDACalcICB to compute consistent initial conditions
     for this backward problem. */

  id         = N_VClone(yy);
  Ith(id, 1) = 1.0;
  Ith(id, 2) = 1.0;
  Ith(id, 3) = 0.0;

  /* Specify which variables are differential (1) and which algebraic (0).*/
  retval = IDASetIdB(ida_mem, indexB, id);
  if (check_retval(&retval, "IDASetId", 1)) { return (1); }

  retval = IDACalcICB(ida_mem, indexB, T1B, yyTB1, ypTB1);
  if (check_retval(&retval, "IDACalcICB", 1)) { return (1); }

  /* Get the consistent IC found by IDAS. */
  retval = IDAGetConsistentICB(ida_mem, indexB, yB, ypB);
  if (check_retval(&retval, "IDAGetConsistentICB", 1)) { return (1); }

  retval = IDASolveB(ida_mem, T0, IDA_NORMAL);
  if (check_retval(&retval, "IDASolveB", 1)) { return (1); }

  retval = IDAGetB(ida_mem, indexB, &time, yB, ypB);
  if (check_retval(&retval, "IDAGetB", 1)) { return (1); }

  retval = IDAGetQuadB(ida_mem, indexB, &time, qB);
  if (check_retval(&retval, "IDAGetQuadB", 1)) { return (1); }

  PrintOutput(TB1, yB, ypB, qB);

  /* Print final statistics to the screen */
  printf("\nFinal Statistics:\n");
  retval = IDAPrintAllStats(IDAGetAdjIDABmem(ida_mem, indexB), stdout,
                            SUN_OUTPUTFORMAT_TABLE);

  /* Print final statistics to a file in CSV format */
  FID    = fopen("idasRoberts_ASAi_dns_bkw1_stats.csv", "w");
  retval = IDAPrintAllStats(IDAGetAdjIDABmem(ida_mem, indexB), FID,
                            SUN_OUTPUTFORMAT_CSV);
  fclose(FID);

  /* Free any memory used.*/

  IDAFree(&ida_mem);
  SUNLinSolFree(LS);
  SUNMatDestroy(A);
  SUNLinSolFree(LSB);
  SUNMatDestroy(AB);
  N_VDestroy(yy);
  N_VDestroy(yp);
  N_VDestroy(q);
  N_VDestroy(yB);
  N_VDestroy(ypB);
  N_VDestroy(qB);
  N_VDestroy(id);
  N_VDestroy(yyTB1);
  N_VDestroy(ypTB1);

  if (ckpnt != NULL) { free(ckpnt); }
  free(data);

  SUNContext_Free(&ctx);

  return (0);
}